

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  long lVar3;
  bool bVar4;
  stbi_uc sVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint x;
  uint y;
  uchar *puVar9;
  char *pcVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  uchar *puVar14;
  uint uVar15;
  stbi_uc sVar16;
  int iVar17;
  stbi_uc *psVar18;
  int left_1;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int *piVar22;
  uint uVar23;
  int left;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_c8;
  stbi_uc local_9c [4];
  ulong local_98;
  stbi_uc *local_90;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint *local_68;
  uint *local_60;
  stbi_uc local_58 [2];
  byte local_56 [38];
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  iVar17 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    psVar18 = s->img_buffer;
    if (psVar18 < s->img_buffer_end) {
LAB_001cb67d:
      s->img_buffer = psVar18 + 1;
    }
    else if (s->read_from_callbacks != 0) {
      iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar8 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar2;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar1;
        s->img_buffer_end = psVar1 + iVar8;
      }
      psVar18 = s->img_buffer;
      goto LAB_001cb67d;
    }
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cb6c1:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_001cbe2c:
      stbi__g_failure_reason = "bad file";
      return (void *)0x0;
    }
  }
  else {
    iVar17 = (*(s->io).eof)(s->io_user_data);
    if (iVar17 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_001cbe2c;
      goto LAB_001cb6c1;
    }
  }
  if ((y != 0) && (((uint)(0x7fffffff / (ulong)y) < x || (0x1fffffff < y * x)))) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  puVar9 = (uchar *)stbi__malloc_mad3(x,y,4,0);
  memset(puVar9,0xff,(ulong)(y * x * 4));
  uVar23 = 0;
  bVar7 = 0;
  piVar22 = comp;
  do {
    if (uVar23 == 10) {
      pcVar10 = "bad format";
LAB_001cb9d6:
      bVar4 = false;
      stbi__g_failure_reason = pcVar10;
    }
    else {
      pbVar11 = s->img_buffer;
      if (pbVar11 < s->img_buffer_end) {
LAB_001cb7e8:
        s->img_buffer = pbVar11 + 1;
        piVar22 = (int *)(ulong)*pbVar11;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar17 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar17;
          }
          pbVar11 = s->img_buffer;
          goto LAB_001cb7e8;
        }
        piVar22 = (int *)0x0;
      }
      psVar18 = s->img_buffer;
      if (psVar18 < s->img_buffer_end) {
LAB_001cb861:
        s->img_buffer = psVar18 + 1;
        sVar16 = *psVar18;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar17 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar17;
          }
          psVar18 = s->img_buffer;
          goto LAB_001cb861;
        }
        sVar16 = '\0';
      }
      lVar3 = (long)(int)uVar23 * 3;
      local_58[lVar3] = sVar16;
      psVar18 = s->img_buffer;
      if (psVar18 < s->img_buffer_end) {
LAB_001cb8f1:
        s->img_buffer = psVar18 + 1;
        sVar5 = *psVar18;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar17 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar17;
          }
          psVar18 = s->img_buffer;
          goto LAB_001cb8f1;
        }
        sVar5 = '\0';
      }
      local_58[lVar3 + 1] = sVar5;
      pbVar11 = s->img_buffer;
      if (pbVar11 < s->img_buffer_end) {
LAB_001cb96c:
        s->img_buffer = pbVar11 + 1;
        bVar6 = *pbVar11;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
          if (iVar17 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar2;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar1;
            s->img_buffer_end = psVar1 + iVar17;
          }
          pbVar11 = s->img_buffer;
          goto LAB_001cb96c;
        }
        bVar6 = 0;
      }
      uVar23 = uVar23 + 1;
      local_58[lVar3 + 2] = bVar6;
      bVar7 = bVar7 | bVar6;
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cb9a9:
        if (s->img_buffer_end <= s->img_buffer) {
LAB_001cb9cc:
          pcVar10 = "bad file";
          goto LAB_001cb9d6;
        }
      }
      else {
        iVar17 = (*(s->io).eof)(s->io_user_data);
        if (iVar17 != 0) {
          if (s->read_from_callbacks != 0) goto LAB_001cb9a9;
          goto LAB_001cb9cc;
        }
      }
      bVar4 = true;
      pcVar10 = "bad format";
      if (sVar16 != '\b') goto LAB_001cb9d6;
    }
    if (!bVar4) goto LAB_001cbe5d;
  } while ((int)piVar22 != 0);
  local_84 = 4 - (uint)((bVar7 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = local_84;
  }
  puVar14 = puVar9;
  if (y != 0) {
    local_88 = x * 4;
    local_80 = (ulong)y;
    local_78 = (ulong)uVar23;
    local_98 = 0;
    do {
      if (0 < (int)uVar23) {
        local_90 = puVar9 + local_88 * (int)local_98;
        uVar13 = 0;
        do {
          lVar3 = uVar13 * 3;
          sVar16 = local_58[lVar3 + 1];
          local_70 = uVar13;
          if (sVar16 == '\0') {
            if (x != 0) {
              bVar7 = local_58[lVar3 + 2];
              psVar18 = local_90;
              uVar19 = x;
              do {
                psVar12 = stbi__readval(s,(uint)bVar7,psVar18);
                if (psVar12 == (stbi_uc *)0x0) goto LAB_001cbe5d;
                psVar18 = psVar18 + 4;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
          }
          else {
            psVar18 = local_90;
            uVar19 = x;
            if (sVar16 == '\x01') {
              while (0 < (int)uVar19) {
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_001cbcea:
                  s->img_buffer = pbVar11 + 1;
                  bVar7 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar17 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar17;
                    }
                    pbVar11 = s->img_buffer;
                    goto LAB_001cbcea;
                  }
                  bVar7 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cbd12:
                  if (s->img_buffer < s->img_buffer_end) goto LAB_001cbd22;
LAB_001cbd82:
                  stbi__g_failure_reason = "bad file";
LAB_001cbd90:
                  bVar4 = false;
                }
                else {
                  iVar17 = (*(s->io).eof)(s->io_user_data);
                  if (iVar17 != 0) {
                    if (s->read_from_callbacks != 0) goto LAB_001cbd12;
                    goto LAB_001cbd82;
                  }
LAB_001cbd22:
                  psVar12 = stbi__readval(s,(uint)local_58[lVar3 + 2],local_9c);
                  if (psVar12 == (stbi_uc *)0x0) goto LAB_001cbd90;
                  if ((int)uVar19 < (int)(uint)bVar7) {
                    bVar7 = (byte)uVar19;
                  }
                  if (bVar7 != 0) {
                    uVar15 = 0;
                    do {
                      bVar6 = local_58[lVar3 + 2];
                      uVar20 = 0x80;
                      lVar21 = 0;
                      do {
                        if ((uVar20 & bVar6) != 0) {
                          psVar18[lVar21] = local_9c[lVar21];
                        }
                        lVar21 = lVar21 + 1;
                        uVar20 = uVar20 >> 1;
                      } while (lVar21 != 4);
                      uVar15 = uVar15 + 1;
                      psVar18 = psVar18 + 4;
                    } while (uVar15 != bVar7);
                  }
                  uVar19 = uVar19 - bVar7;
                  bVar4 = true;
                }
                if (!bVar4) goto LAB_001cbe5d;
              }
            }
            else {
              local_c8 = x;
              if (sVar16 != '\x02') {
                stbi__g_failure_reason = "bad format";
                puVar14 = (uchar *)0x0;
                goto LAB_001cbe72;
              }
              while (0 < (int)local_c8) {
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_001cbb33:
                  s->img_buffer = pbVar11 + 1;
                  bVar7 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar17 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar17 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar17;
                    }
                    pbVar11 = s->img_buffer;
                    goto LAB_001cbb33;
                  }
                  bVar7 = 0;
                }
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cbb5b:
                  if (s->img_buffer < s->img_buffer_end) goto LAB_001cbb6b;
LAB_001cbbab:
                  stbi__g_failure_reason = "bad file";
LAB_001cbbb9:
                  bVar4 = false;
                }
                else {
                  iVar17 = (*(s->io).eof)(s->io_user_data);
                  if (iVar17 != 0) {
                    if (s->read_from_callbacks != 0) goto LAB_001cbb5b;
                    goto LAB_001cbbab;
                  }
LAB_001cbb6b:
                  uVar19 = (uint)bVar7;
                  if ((char)bVar7 < '\0') {
                    if (uVar19 == 0x80) {
                      iVar17 = stbi__get16be(s);
                    }
                    else {
                      iVar17 = uVar19 - 0x7f;
                    }
                    if ((int)local_c8 < iVar17) {
                      stbi__g_failure_reason = "bad file";
LAB_001cbc62:
                      bVar4 = false;
                    }
                    else {
                      psVar12 = stbi__readval(s,(uint)local_58[lVar3 + 2],local_9c);
                      if (psVar12 == (stbi_uc *)0x0) goto LAB_001cbc62;
                      bVar4 = true;
                      if (0 < iVar17) {
                        iVar8 = 0;
                        do {
                          bVar7 = local_58[lVar3 + 2];
                          uVar19 = 0x80;
                          lVar21 = 0;
                          do {
                            if ((uVar19 & bVar7) != 0) {
                              psVar18[lVar21] = local_9c[lVar21];
                            }
                            lVar21 = lVar21 + 1;
                            uVar19 = uVar19 >> 1;
                          } while (lVar21 != 4);
                          iVar8 = iVar8 + 1;
                          psVar18 = psVar18 + 4;
                        } while (iVar8 != iVar17);
                      }
                    }
                    if (!bVar4) goto LAB_001cbbb9;
                  }
                  else {
                    if ((int)local_c8 <= (int)uVar19) {
                      stbi__g_failure_reason = "bad file";
LAB_001cbbe3:
                      bVar4 = false;
                      goto LAB_001cbc72;
                    }
                    iVar17 = uVar19 + 1;
                    iVar8 = uVar19 + 1;
                    do {
                      psVar12 = stbi__readval(s,(uint)local_58[lVar3 + 2],psVar18);
                      if (psVar12 == (stbi_uc *)0x0) goto LAB_001cbbe3;
                      psVar18 = psVar18 + 4;
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                  local_c8 = local_c8 - iVar17;
                  bVar4 = true;
                }
LAB_001cbc72:
                if (!bVar4) goto LAB_001cbe5d;
              }
            }
          }
          uVar13 = local_70 + 1;
        } while (uVar13 != local_78);
      }
      local_98 = local_98 + 1;
    } while (local_98 != local_80);
  }
LAB_001cbe72:
  if (puVar14 == (uchar *)0x0) {
    free(puVar9);
    puVar9 = (uchar *)0x0;
  }
  *local_68 = x;
  *local_60 = y;
  iVar17 = local_84;
  if (req_comp != 0) {
    iVar17 = req_comp;
  }
  if (req_comp == 0 && comp != (int *)0x0) {
    iVar17 = *comp;
  }
  puVar9 = stbi__convert_format(puVar9,4,iVar17,x,y);
  return puVar9;
LAB_001cbe5d:
  puVar14 = (uchar *)0x0;
  goto LAB_001cbe72;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}